

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdppm.c
# Opt level: O2

JDIMENSION get_text_gray_row(j_compress_ptr cinfo,cjpeg_source_ptr sinfo)

{
  uint maxval;
  JDIMENSION JVar1;
  FILE *infile;
  FILE *pFVar2;
  JSAMPROW pJVar3;
  uint uVar4;
  long lVar5;
  
  infile = sinfo->input_file;
  pFVar2 = sinfo[1].input_file;
  maxval = *(uint *)&sinfo[1].buffer;
  pJVar3 = *sinfo->buffer;
  JVar1 = cinfo->image_width;
  for (lVar5 = 0; JVar1 != (JDIMENSION)lVar5; lVar5 = lVar5 + 1) {
    uVar4 = read_pbm_integer(cinfo,infile,maxval);
    pJVar3[lVar5] = *(JSAMPLE *)((long)&pFVar2->_flags + (ulong)uVar4);
  }
  return 1;
}

Assistant:

METHODDEF(JDIMENSION)
get_text_gray_row(j_compress_ptr cinfo, cjpeg_source_ptr sinfo)
/* This version is for reading text-format PGM files with any maxval */
{
  ppm_source_ptr source = (ppm_source_ptr)sinfo;
  FILE *infile = source->pub.input_file;
  register JSAMPROW ptr;
  register JSAMPLE *rescale = source->rescale;
  JDIMENSION col;
  unsigned int maxval = source->maxval;

  ptr = source->pub.buffer[0];
  for (col = cinfo->image_width; col > 0; col--) {
    *ptr++ = rescale[read_pbm_integer(cinfo, infile, maxval)];
  }
  return 1;
}